

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O3

void __thiscall disp::test(disp *this)

{
  string *psVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  ostringstream oss;
  string asStack_d48 [32];
  string local_d28 [11];
  undefined1 *local_bb0 [2];
  undefined1 local_ba0 [16];
  undefined1 *local_b90 [2];
  undefined1 local_b80 [16];
  undefined1 *local_b70 [2];
  undefined1 local_b60 [16];
  undefined1 *local_b50 [2];
  undefined1 local_b40 [16];
  undefined1 *local_b30 [2];
  undefined1 local_b20 [16];
  undefined1 *local_b10 [2];
  undefined1 local_b00 [16];
  undefined1 *local_af0 [2];
  undefined1 local_ae0 [16];
  undefined1 *local_ad0 [2];
  undefined1 local_ac0 [16];
  undefined1 *local_ab0 [2];
  undefined1 local_aa0 [16];
  undefined1 *local_a90 [2];
  undefined1 local_a80 [16];
  undefined1 *local_a70 [2];
  undefined1 local_a60 [16];
  undefined1 *local_a50 [2];
  undefined1 local_a40 [16];
  undefined1 *local_a30 [2];
  undefined1 local_a20 [16];
  undefined1 *local_a10 [2];
  undefined1 local_a00 [16];
  undefined1 *local_9f0 [2];
  undefined1 local_9e0 [16];
  undefined1 *local_9d0 [2];
  undefined1 local_9c0 [16];
  undefined1 *local_9b0 [2];
  undefined1 local_9a0 [16];
  undefined1 *local_990 [2];
  undefined1 local_980 [16];
  undefined1 *local_970 [2];
  undefined1 local_960 [16];
  undefined1 *local_950 [2];
  undefined1 local_940 [16];
  undefined1 *local_930 [2];
  undefined1 local_920 [16];
  undefined1 *local_910 [2];
  undefined1 local_900 [16];
  undefined1 *local_8f0 [2];
  undefined1 local_8e0 [16];
  undefined1 *local_8d0 [2];
  undefined1 local_8c0 [16];
  undefined1 *local_8b0 [2];
  undefined1 local_8a0 [16];
  undefined1 *local_890 [2];
  undefined1 local_880 [16];
  undefined1 *local_870 [2];
  undefined1 local_860 [16];
  undefined1 *local_850 [2];
  undefined1 local_840 [16];
  undefined1 *local_830 [2];
  undefined1 local_820 [16];
  undefined1 *local_810 [2];
  undefined1 local_800 [16];
  undefined1 *local_7f0 [2];
  undefined1 local_7e0 [16];
  undefined1 *local_7d0 [2];
  undefined1 local_7c0 [16];
  undefined1 *local_7b0 [2];
  undefined1 local_7a0 [16];
  undefined1 *local_790 [2];
  undefined1 local_780 [16];
  undefined1 *local_770 [2];
  undefined1 local_760 [16];
  undefined1 *local_750 [2];
  undefined1 local_740 [16];
  undefined1 *local_730 [2];
  undefined1 local_720 [16];
  undefined1 *local_710 [2];
  undefined1 local_700 [16];
  undefined1 *local_6f0 [2];
  undefined1 local_6e0 [16];
  undefined1 *local_6d0 [2];
  undefined1 local_6c0 [16];
  undefined1 *local_6b0 [2];
  undefined1 local_6a0 [16];
  undefined1 *local_690 [2];
  undefined1 local_680 [16];
  undefined1 *local_670 [2];
  undefined1 local_660 [16];
  undefined1 *local_650 [2];
  undefined1 local_640 [16];
  undefined1 *local_630 [2];
  undefined1 local_620 [16];
  undefined1 *local_610 [2];
  undefined1 local_600 [16];
  undefined1 *local_5f0 [2];
  undefined1 local_5e0 [16];
  undefined1 *local_5d0 [2];
  undefined1 local_5c0 [16];
  undefined1 *local_5b0 [2];
  undefined1 local_5a0 [16];
  undefined1 *local_590 [2];
  undefined1 local_580 [16];
  undefined1 *local_570 [2];
  undefined1 local_560 [16];
  undefined1 *local_550 [2];
  undefined1 local_540 [16];
  undefined1 *local_530 [2];
  undefined1 local_520 [16];
  undefined1 *local_510 [2];
  undefined1 local_500 [16];
  undefined1 *local_4f0 [2];
  undefined1 local_4e0 [16];
  undefined1 *local_4d0 [2];
  undefined1 local_4c0 [16];
  undefined1 *local_4b0 [2];
  undefined1 local_4a0 [16];
  undefined1 *local_490 [2];
  undefined1 local_480 [16];
  undefined1 *local_470 [2];
  undefined1 local_460 [16];
  undefined1 *local_450 [2];
  undefined1 local_440 [16];
  undefined1 *local_430 [2];
  undefined1 local_420 [16];
  undefined1 *local_410 [2];
  undefined1 local_400 [16];
  undefined1 *local_3f0 [2];
  undefined1 local_3e0 [16];
  undefined1 *local_3d0 [2];
  undefined1 local_3c0 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_398;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_388;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_378;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_368;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_358;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_348;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_338;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_328;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_318;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_308;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_278;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_268;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_258;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_3d0[0] = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"hg/x","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_3d0);
  if (local_3d0[0] != local_3c0) {
    operator_delete(local_3d0[0]);
  }
  psVar1 = &this->v_;
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xe2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==\"m:hg/x:x\"",0xf);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3f0[0] = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"h0","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_3f0);
  if (local_3f0[0] != local_3e0) {
    operator_delete(local_3f0[0]);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xe3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==\"-\"",8);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_410[0] = local_400;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"h1/a1","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_410);
  if (local_410[0] != local_400) {
    operator_delete(local_410[0]);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xe4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==\":1\"",9);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_430[0] = local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"h2/a1/a2","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_430);
  if (local_430[0] != local_420) {
    operator_delete(local_430[0]);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xe5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==\":1:2\"",0xb);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_450[0] = local_440;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"h3/a1/a2/a3","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_450);
  if (local_450[0] != local_440) {
    operator_delete(local_450[0]);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xe6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==\":1:2:3\"",0xd);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_470[0] = local_460;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"h4/a1/a2/a3/a4","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_470);
  if (local_470[0] != local_460) {
    operator_delete(local_470[0]);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xe7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==\":1:2:3:4\"",0xf);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_490[0] = local_480;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"h5/a1/a2/a3/a4/a5","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_490);
  if (local_490[0] != local_480) {
    operator_delete(local_490[0]);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xe8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==\":1:2:3:4:5\"",0x11);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_4b0[0] = local_4a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"h6/a1/a2/a3/a4/a5/a6","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_4b0);
  if (local_4b0[0] != local_4a0) {
    operator_delete(local_4b0[0]);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xe9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==\":1:2:3:4:5:6\"",0x13);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)(this->v_)._M_string_length,0x132ef1);
  paVar3 = &local_d28[0].field_2;
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_4d0[0] = local_4c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"/h0","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_4d0);
  if (local_4d0[0] != local_4c0) {
    operator_delete(local_4d0[0]);
  }
  cppcms::application::release_context();
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  psVar2 = &(this->v_)._M_string_length;
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"-",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xec);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"-\")",10);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_4f0[0] = local_4e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4f0,"/rh0","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_4f0);
  if (local_4f0[0] != local_4e0) {
    operator_delete(local_4f0[0]);
  }
  cppcms::application::release_context();
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"-",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xed);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"-\")",10);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_510[0] = local_500;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"/RH0","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_510);
  if (local_510[0] != local_500) {
    operator_delete(local_510[0]);
  }
  cppcms::application::release_context();
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"-",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xee);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"-\")",10);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_530[0] = local_520;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"/h1_num/123.3","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_530);
  if (local_530[0] != local_520) {
    operator_delete(local_530[0]);
  }
  cppcms::application::release_context();
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"h1_d:to_str(123.3)",0x12);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xef);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"h1_d:to_str(123.3)\")",0x1b);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_550[0] = local_540;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"/h1_num/123","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_550);
  if (local_550[0] != local_540) {
    operator_delete(local_550[0]);
  }
  cppcms::application::release_context();
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"h1_i:to_str(123)",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xf0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"h1_i:to_str(123)\")",0x19);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_570[0] = local_560;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"/h1_num/123 23","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_570);
  if (local_570[0] != local_560) {
    operator_delete(local_570[0]);
  }
  cppcms::application::release_context();
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"none",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"none\")",0xd);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_590[0] = local_580;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"/h1_s/1111","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_590);
  if (local_590[0] != local_580) {
    operator_delete(local_590[0]);
  }
  cppcms::application::release_context();
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"h1_s:1111",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xf2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"h1_s:1111\")",0x12);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_5b0[0] = local_5a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"/RH1_S/1111","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_5b0);
  if (local_5b0[0] != local_5a0) {
    operator_delete(local_5b0[0]);
  }
  cppcms::application::release_context();
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"h1_s:1111",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xf3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"h1_s:1111\")",0x12);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_5d0[0] = local_5c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"/h1_s_c/1111","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_5d0);
  if (local_5d0[0] != local_5c0) {
    operator_delete(local_5d0[0]);
  }
  cppcms::application::release_context();
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"h1_s_c:1111",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xf4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"h1_s_c:1111\")",0x14);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_5f0[0] = local_5e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"/h1_s_r/1111","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_5f0);
  if (local_5f0[0] != local_5e0) {
    operator_delete(local_5f0[0]);
  }
  cppcms::application::release_context();
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"h1_s_r:1111",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xf5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"h1_s_r:1111\")",0x14);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_610[0] = local_600;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_610,"/h1_s_cr/1111","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_610);
  if (local_610[0] != local_600) {
    operator_delete(local_610[0]);
  }
  cppcms::application::release_context();
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"h1_s_cr:1111",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xf6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"h1_s_cr:1111\")",0x15);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_630[0] = local_620;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_630,anon_var_dwarf_11275,anon_var_dwarf_11275 + 0xe);
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_630);
  if (local_630[0] != local_620) {
    operator_delete(local_630[0]);
  }
  cppcms::application::release_context();
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"none",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xf7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"none\")",0xd);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_650[0] = local_640;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_650,anon_var_dwarf_11275,anon_var_dwarf_11275 + 0xe);
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_650);
  if (local_650[0] != local_640) {
    operator_delete(local_650[0]);
  }
  cppcms::application::release_context();
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"none",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xf8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"none\")",0xd);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_670[0] = local_660;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_670,anon_var_dwarf_11281,anon_var_dwarf_11281 + 0x18);
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_670);
  if (local_670[0] != local_660) {
    operator_delete(local_670[0]);
  }
  cppcms::application::release_context();
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,anon_var_dwarf_1128d,0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xfb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               " v_==(\"h1_s:\\xD7\\xA9\\xD7\\x9C\\xD7\\x95\\xD7\\x9D\\x20\\xE6\\x97\\xA5\\xE6\\x9C\\xAC\\xE8\\xAA\\x9E\")"
               ,0x56);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_690[0] = local_680;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_690,anon_var_dwarf_112b3,anon_var_dwarf_112b3 + 7);
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_690);
  if (local_690[0] != local_680) {
    operator_delete(local_690[0]);
  }
  cppcms::application::release_context();
  if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"none",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xfc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"none\")",0xd);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_6b0[0] = local_6a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6b0,"/res","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_6b0);
  if (local_6b0[0] != local_6a0) {
    operator_delete(local_6b0[0]);
  }
  cppcms::application::release_context();
  if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_0",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xfe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_0\")",0xe);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_6d0[0] = local_6c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d0,"/res/a1","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_6d0);
  if (local_6d0[0] != local_6c0) {
    operator_delete(local_6d0[0]);
  }
  cppcms::application::release_context();
  if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_1:to_str(1)",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_1:to_str(1)\")",0x18);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_6f0[0] = local_6e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f0,"/res/a1/a2","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_6f0);
  if (local_6f0[0] != local_6e0) {
    operator_delete(local_6f0[0]);
  }
  cppcms::application::release_context();
  if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_2:to_str(1):to_str(2)",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x100);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," v_==(\"get_2:to_str(1):to_str(2)\")",0x22);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"POST","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_710[0] = local_700;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_710,"/res","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_710);
  if (local_710[0] != local_700) {
    operator_delete(local_710[0]);
  }
  cppcms::application::release_context();
  if (local_158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"p_0",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x102);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"p_0\")",0xc);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"POST","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_730[0] = local_720;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"/res/a1","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_730);
  if (local_730[0] != local_720) {
    operator_delete(local_730[0]);
  }
  cppcms::application::release_context();
  if (local_168 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"p_1:to_str(1)",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x103);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"p_1:to_str(1)\")",0x16);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"POST","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_750[0] = local_740;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"/res/a1/a2","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_750);
  if (local_750[0] != local_740) {
    operator_delete(local_750[0]);
  }
  cppcms::application::release_context();
  if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"p_2:to_str(1):to_str(2)",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x104);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," v_==(\"p_2:to_str(1):to_str(2)\")",0x20);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"PUT","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_770[0] = local_760;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_770,"/res","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_770);
  if (local_770[0] != local_760) {
    operator_delete(local_770[0]);
  }
  cppcms::application::release_context();
  if (local_188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"p_0",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x106);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"p_0\")",0xc);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"PUT","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_790[0] = local_780;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_790,"/res/a1","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_790);
  if (local_790[0] != local_780) {
    operator_delete(local_790[0]);
  }
  cppcms::application::release_context();
  if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"p_1:to_str(1)",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x107);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"p_1:to_str(1)\")",0x16);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"PUT","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_7b0[0] = local_7a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7b0,"/res/a1/a2","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_7b0);
  if (local_7b0[0] != local_7a0) {
    operator_delete(local_7b0[0]);
  }
  cppcms::application::release_context();
  if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"p_2:to_str(1):to_str(2)",0x17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x108);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," v_==(\"p_2:to_str(1):to_str(2)\")",0x20);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"DELETE","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_7d0[0] = local_7c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7d0,"/res","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_7d0);
  if (local_7d0[0] != local_7c0) {
    operator_delete(local_7d0[0]);
  }
  cppcms::application::release_context();
  if (local_1b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"none",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x10a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"none\")",0xd);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"DELETE","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_7f0[0] = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7f0,"/res/a1","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_7f0);
  if (local_7f0[0] != local_7e0) {
    operator_delete(local_7f0[0]);
  }
  cppcms::application::release_context();
  if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"none",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x10b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"none\")",0xd);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"DELETE","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_810[0] = local_800;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_810,"/res/a1/a2","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_810);
  if (local_810[0] != local_800) {
    operator_delete(local_810[0]);
  }
  cppcms::application::release_context();
  if (local_1d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"none",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x10c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"none\")",0xd);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_830[0] = local_820;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"/point/123,23","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_830);
  if (local_830[0] != local_820) {
    operator_delete(local_830[0]);
  }
  cppcms::application::release_context();
  if (local_1e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"point:to_str(123)Xto_str(23)",0x1c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x10e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," v_==(\"point:to_str(123)Xto_str(23)\")",0x25);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_850[0] = local_840;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_850,"/point/123","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_850);
  if (local_850[0] != local_840) {
    operator_delete(local_850[0]);
  }
  cppcms::application::release_context();
  if (local_1f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"none",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x10f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"none\")",0xd);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_870[0] = local_860;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_870,"/point/123,23.2","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_870);
  if (local_870[0] != local_860) {
    operator_delete(local_870[0]);
  }
  cppcms::application::release_context();
  if (local_208 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_208);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"none",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"none\")",0xd);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_890[0] = local_880;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_890,"/foo/abcd","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_890);
  if (local_890[0] != local_880) {
    operator_delete(local_890[0]);
  }
  cppcms::application::release_context();
  if (local_218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"foo:to_str(4)",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x112);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"foo:to_str(4)\")",0x16);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_8b0[0] = local_8a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b0,"/foo/abcdefg","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_8b0);
  if (local_8b0[0] != local_8a0) {
    operator_delete(local_8b0[0]);
  }
  cppcms::application::release_context();
  if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"foo:to_str(7)",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x113);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"foo:to_str(7)\")",0x16);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_8d0[0] = local_8c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d0,"/res_1/a1/a2/a3","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_8d0);
  if (local_8d0[0] != local_8c0) {
    operator_delete(local_8d0[0]);
  }
  cppcms::application::release_context();
  if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_3:1:2:3",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x115);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_3:1:2:3\")",0x14);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_8f0[0] = local_8e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f0,"/res_2/a1/a2/a3","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_8f0);
  if (local_8f0[0] != local_8e0) {
    operator_delete(local_8f0[0]);
  }
  cppcms::application::release_context();
  if (local_248 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_3:1:2:3",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x116);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_3:1:2:3\")",0x14);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_910[0] = local_900;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_910,"/res_3/a1/a2/a3","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_910);
  if (local_910[0] != local_900) {
    operator_delete(local_910[0]);
  }
  cppcms::application::release_context();
  if (local_258 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_3:1:2:3",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x117);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_3:1:2:3\")",0x14);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_930[0] = local_920;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_930,"/res_4/a1/a2/a3","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_930);
  if (local_930[0] != local_920) {
    operator_delete(local_930[0]);
  }
  cppcms::application::release_context();
  if (local_268 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_268);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_3:1:2:3",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x118);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_3:1:2:3\")",0x14);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_950[0] = local_940;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_950,"/res_1/a1/a2/a3/a4","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_950);
  if (local_950[0] != local_940) {
    operator_delete(local_950[0]);
  }
  cppcms::application::release_context();
  if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_4:1:2:3:4",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_4:1:2:3:4\")",0x16);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_970[0] = local_960;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_970,"/res_2/a1/a2/a3/a4","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_970);
  if (local_970[0] != local_960) {
    operator_delete(local_970[0]);
  }
  cppcms::application::release_context();
  if (local_288 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_4:1:2:3:4",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x11b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_4:1:2:3:4\")",0x16);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_990[0] = local_980;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_990,"/res_3/a1/a2/a3/a4","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_990);
  if (local_990[0] != local_980) {
    operator_delete(local_990[0]);
  }
  cppcms::application::release_context();
  if (local_298 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_4:1:2:3:4",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x11c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_4:1:2:3:4\")",0x16);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_9b0[0] = local_9a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9b0,"/res_4/a1/a2/a3/a4","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_9b0);
  if (local_9b0[0] != local_9a0) {
    operator_delete(local_9b0[0]);
  }
  cppcms::application::release_context();
  if (local_2a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_4:1:2:3:4",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x11d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_4:1:2:3:4\")",0x16);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_9d0[0] = local_9c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9d0,"/res_1/a1/a2/a3/a4/a5","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_9d0);
  if (local_9d0[0] != local_9c0) {
    operator_delete(local_9d0[0]);
  }
  cppcms::application::release_context();
  if (local_2b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_5:1:2:3:4:5",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x11f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_5:1:2:3:4:5\")",0x18);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_9f0[0] = local_9e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f0,"/res_2/a1/a2/a3/a4/a5","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_9f0);
  if (local_9f0[0] != local_9e0) {
    operator_delete(local_9f0[0]);
  }
  cppcms::application::release_context();
  if (local_2c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_5:1:2:3:4:5",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_5:1:2:3:4:5\")",0x18);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_a10[0] = local_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"/res_3/a1/a2/a3/a4/a5","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_a10);
  if (local_a10[0] != local_a00) {
    operator_delete(local_a10[0]);
  }
  cppcms::application::release_context();
  if (local_2d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_5:1:2:3:4:5",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x121);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_5:1:2:3:4:5\")",0x18);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_a30[0] = local_a20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a30,"/res_4/a1/a2/a3/a4/a5","");
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_a30);
  if (local_a30[0] != local_a20) {
    operator_delete(local_a30[0]);
  }
  cppcms::application::release_context();
  if (local_2e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2e8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_5:1:2:3:4:5",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x122);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_5:1:2:3:4:5\")",0x18);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_a50[0] = local_a40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a50,"/res_1/a1/a2/a3/a4/a5/a6","")
  ;
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_a50);
  if (local_a50[0] != local_a40) {
    operator_delete(local_a50[0]);
  }
  cppcms::application::release_context();
  if (local_2f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f8);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_6:1:2:3:4:5:6",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x124);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_6:1:2:3:4:5:6\")",0x1a);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_a70[0] = local_a60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a70,"/res_2/a1/a2/a3/a4/a5/a6","")
  ;
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_a70);
  if (local_a70[0] != local_a60) {
    operator_delete(local_a70[0]);
  }
  cppcms::application::release_context();
  if (local_308 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_308);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_6:1:2:3:4:5:6",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x125);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_6:1:2:3:4:5:6\")",0x1a);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
  local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
  set_context(this,local_d28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_d28[0]._M_dataplus._M_p);
  }
  local_a90[0] = local_a80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a90,"/res_3/a1/a2/a3/a4/a5/a6","")
  ;
  (**(code **)(*(long *)this + 0x10))(this,(string *)local_a90);
  if (local_a90[0] != local_a80) {
    operator_delete(local_a90[0]);
  }
  cppcms::application::release_context();
  if (local_318 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_318);
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_6:1:2:3:4:5:6",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 == 0) {
    std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
    local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
    set_context(this,local_d28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d28[0]._M_dataplus._M_p != paVar3) {
      operator_delete(local_d28[0]._M_dataplus._M_p);
    }
    local_ab0[0] = local_aa0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ab0,"/res_4/a1/a2/a3/a4/a5/a6","");
    (**(code **)(*(long *)this + 0x10))(this,(string *)local_ab0);
    if (local_ab0[0] != local_aa0) {
      operator_delete(local_ab0[0]);
    }
    cppcms::application::release_context();
    if (local_328 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_328);
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_6:1:2:3:4:5:6",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_d28,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x127);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_6:1:2:3:4:5:6\")",0x1a)
      ;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,asStack_d48);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
    local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
    set_context(this,local_d28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d28[0]._M_dataplus._M_p != paVar3) {
      operator_delete(local_d28[0]._M_dataplus._M_p);
    }
    local_ad0[0] = local_ac0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_ad0,"/res_1/a1/a2/a3/a4/a5/a6/a7","");
    (**(code **)(*(long *)this + 0x10))(this,(string *)local_ad0);
    if (local_ad0[0] != local_ac0) {
      operator_delete(local_ad0[0]);
    }
    cppcms::application::release_context();
    if (local_338 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_338);
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_7:1:2:3:4:5:6:7",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_d28,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x129);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," v_==(\"get_7:1:2:3:4:5:6:7\")",0x1c);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,asStack_d48);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
    local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
    set_context(this,local_d28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d28[0]._M_dataplus._M_p != paVar3) {
      operator_delete(local_d28[0]._M_dataplus._M_p);
    }
    local_af0[0] = local_ae0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_af0,"/res_2/a1/a2/a3/a4/a5/a6/a7","");
    (**(code **)(*(long *)this + 0x10))(this,(string *)local_af0);
    if (local_af0[0] != local_ae0) {
      operator_delete(local_af0[0]);
    }
    cppcms::application::release_context();
    if (local_348 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_348);
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_7:1:2:3:4:5:6:7",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_d28,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x12a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," v_==(\"get_7:1:2:3:4:5:6:7\")",0x1c);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,asStack_d48);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
    local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
    set_context(this,local_d28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d28[0]._M_dataplus._M_p != paVar3) {
      operator_delete(local_d28[0]._M_dataplus._M_p);
    }
    local_b10[0] = local_b00;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b10,"/res_3/a1/a2/a3/a4/a5/a6/a7","");
    (**(code **)(*(long *)this + 0x10))(this,(string *)local_b10);
    if (local_b10[0] != local_b00) {
      operator_delete(local_b10[0]);
    }
    cppcms::application::release_context();
    if (local_358 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358);
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_7:1:2:3:4:5:6:7",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_d28,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,299);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," v_==(\"get_7:1:2:3:4:5:6:7\")",0x1c);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,asStack_d48);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
    local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
    set_context(this,local_d28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d28[0]._M_dataplus._M_p != paVar3) {
      operator_delete(local_d28[0]._M_dataplus._M_p);
    }
    local_b30[0] = local_b20;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b30,"/res_4/a1/a2/a3/a4/a5/a6/a7","");
    (**(code **)(*(long *)this + 0x10))(this,(string *)local_b30);
    if (local_b30[0] != local_b20) {
      operator_delete(local_b30[0]);
    }
    cppcms::application::release_context();
    if (local_368 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368);
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_7:1:2:3:4:5:6:7",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_d28,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,300);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," v_==(\"get_7:1:2:3:4:5:6:7\")",0x1c);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,asStack_d48);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
    local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
    set_context(this,local_d28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d28[0]._M_dataplus._M_p != paVar3) {
      operator_delete(local_d28[0]._M_dataplus._M_p);
    }
    local_b50[0] = local_b40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b50,"/res_1/a1/a2/a3/a4/a5/a6/a7/a8","");
    (**(code **)(*(long *)this + 0x10))(this,(string *)local_b50);
    if (local_b50[0] != local_b40) {
      operator_delete(local_b50[0]);
    }
    cppcms::application::release_context();
    if (local_378 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_378);
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_8:1:2:3:4:5:6:7:8",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 == 0) {
      std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
      local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
      set_context(this,local_d28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d28[0]._M_dataplus._M_p != paVar3) {
        operator_delete(local_d28[0]._M_dataplus._M_p);
      }
      local_b70[0] = local_b60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b70,"/res_2/a1/a2/a3/a4/a5/a6/a7/a8","");
      (**(code **)(*(long *)this + 0x10))(this,(string *)local_b70);
      if (local_b70[0] != local_b60) {
        operator_delete(local_b70[0]);
      }
      cppcms::application::release_context();
      if (local_388 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_388);
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_8:1:2:3:4:5:6:7:8",0x15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_d28,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                   ,0x62);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x12f);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," v_==(\"get_8:1:2:3:4:5:6:7:8\")",0x1e);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,asStack_d48);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
      local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
      set_context(this,local_d28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d28[0]._M_dataplus._M_p != paVar3) {
        operator_delete(local_d28[0]._M_dataplus._M_p);
      }
      local_b90[0] = local_b80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b90,"/res_3/a1/a2/a3/a4/a5/a6/a7/a8","");
      (**(code **)(*(long *)this + 0x10))(this,(string *)local_b90);
      if (local_b90[0] != local_b80) {
        operator_delete(local_b90[0]);
      }
      cppcms::application::release_context();
      if (local_398 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_398);
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_8:1:2:3:4:5:6:7:8",0x15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_d28,
                   "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                   ,0x62);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x130);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," v_==(\"get_8:1:2:3:4:5:6:7:8\")",0x1e);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,asStack_d48);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)*psVar2,0x132ef1);
      local_d28[0]._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"GET","");
      set_context(this,local_d28);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d28[0]._M_dataplus._M_p != paVar3) {
        operator_delete(local_d28[0]._M_dataplus._M_p);
      }
      local_bb0[0] = local_ba0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_bb0,"/res_4/a1/a2/a3/a4/a5/a6/a7/a8","");
      (**(code **)(*(long *)this + 0x10))(this,(string *)local_bb0);
      if (local_bb0[0] != local_ba0) {
        operator_delete(local_bb0[0]);
      }
      cppcms::application::release_context();
      if (local_3a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a8);
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"v=",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(psVar1->_M_dataplus)._M_p,*psVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," exp=",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"get_8:1:2:3:4:5:6:7:8",0x15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_d28,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                 ,0x62);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x131);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," v_==(\"get_8:1:2:3:4:5:6:7:8\")",0x1e);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar6,asStack_d48);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
               ,0x62);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x12e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5," v_==(\"get_8:1:2:3:4:5:6:7:8\")",0x1e);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,asStack_d48);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_d28,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d28,":",1);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_d28,0x126);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," v_==(\"get_6:1:2:3:4:5:6\")",0x1a);
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar6,asStack_d48);
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test()
	{
		TESTD("hg/x","m:hg/x:x");
		TESTD("h0","-");
		TESTD("h1/a1",":1");
		TESTD("h2/a1/a2",":1:2");
		TESTD("h3/a1/a2/a3",":1:2:3");
		TESTD("h4/a1/a2/a3/a4",":1:2:3:4");
		TESTD("h5/a1/a2/a3/a4/a5",":1:2:3:4:5");
		TESTD("h6/a1/a2/a3/a4/a5/a6",":1:2:3:4:5:6");


		TESTM("GET","/h0","-");
		TESTM("GET","/rh0","-");
		TESTM("GET","/RH0","-");
		TESTM("GET","/h1_num/123.3","h1_d:to_str(123.3)");
		TESTM("GET","/h1_num/123","h1_i:to_str(123)");
		TESTM("GET","/h1_num/123 23","none");
		TESTM("GET","/h1_s/1111","h1_s:1111");
		TESTM("GET","/RH1_S/1111","h1_s:1111");
		TESTM("GET","/h1_s_c/1111","h1_s_c:1111");
		TESTM("GET","/h1_s_r/1111","h1_s_r:1111");
		TESTM("GET","/h1_s_cr/1111","h1_s_cr:1111");
		TESTM("GET","/h1_s_cr/1111\xFF","none");
		TESTM("GET","/h1_s_cr/1111\xFF","none");
		
		TESTM("GET","/name/\xD7\xA9\xD7\x9C\xD7\x95\xD7\x9D\x20\xE6\x97\xA5\xE6\x9C\xAC\xE8\xAA\x9E",
			   "h1_s:\xD7\xA9\xD7\x9C\xD7\x95\xD7\x9D\x20\xE6\x97\xA5\xE6\x9C\xAC\xE8\xAA\x9E");
		TESTM("GET","/name/\xFF","none");

		TESTM("GET","/res","get_0");
		TESTM("GET","/res/a1","get_1:to_str(1)");
		TESTM("GET","/res/a1/a2","get_2:to_str(1):to_str(2)");
		
		TESTM("POST","/res","p_0");
		TESTM("POST","/res/a1","p_1:to_str(1)");
		TESTM("POST","/res/a1/a2","p_2:to_str(1):to_str(2)");

		TESTM("PUT","/res","p_0");
		TESTM("PUT","/res/a1","p_1:to_str(1)");
		TESTM("PUT","/res/a1/a2","p_2:to_str(1):to_str(2)");

		TESTM("DELETE","/res","none");
		TESTM("DELETE","/res/a1","none");
		TESTM("DELETE","/res/a1/a2","none");

		TESTM("GET","/point/123,23","point:to_str(123)Xto_str(23)");
		TESTM("GET","/point/123","none");
		TESTM("GET","/point/123,23.2","none");

		TESTM("GET","/foo/abcd","foo:to_str(4)");
		TESTM("GET","/foo/abcdefg","foo:to_str(7)");
		
		TESTM("GET","/res_1/a1/a2/a3","get_3:1:2:3");
		TESTM("GET","/res_2/a1/a2/a3","get_3:1:2:3");
		TESTM("GET","/res_3/a1/a2/a3","get_3:1:2:3");
		TESTM("GET","/res_4/a1/a2/a3","get_3:1:2:3");
		
		TESTM("GET","/res_1/a1/a2/a3/a4","get_4:1:2:3:4");
		TESTM("GET","/res_2/a1/a2/a3/a4","get_4:1:2:3:4");
		TESTM("GET","/res_3/a1/a2/a3/a4","get_4:1:2:3:4");
		TESTM("GET","/res_4/a1/a2/a3/a4","get_4:1:2:3:4");
		
		TESTM("GET","/res_1/a1/a2/a3/a4/a5","get_5:1:2:3:4:5");
		TESTM("GET","/res_2/a1/a2/a3/a4/a5","get_5:1:2:3:4:5");
		TESTM("GET","/res_3/a1/a2/a3/a4/a5","get_5:1:2:3:4:5");
		TESTM("GET","/res_4/a1/a2/a3/a4/a5","get_5:1:2:3:4:5");

		TESTM("GET","/res_1/a1/a2/a3/a4/a5/a6","get_6:1:2:3:4:5:6");
		TESTM("GET","/res_2/a1/a2/a3/a4/a5/a6","get_6:1:2:3:4:5:6");
		TESTM("GET","/res_3/a1/a2/a3/a4/a5/a6","get_6:1:2:3:4:5:6");
		TESTM("GET","/res_4/a1/a2/a3/a4/a5/a6","get_6:1:2:3:4:5:6");
		
		TESTM("GET","/res_1/a1/a2/a3/a4/a5/a6/a7","get_7:1:2:3:4:5:6:7");
		TESTM("GET","/res_2/a1/a2/a3/a4/a5/a6/a7","get_7:1:2:3:4:5:6:7");
		TESTM("GET","/res_3/a1/a2/a3/a4/a5/a6/a7","get_7:1:2:3:4:5:6:7");
		TESTM("GET","/res_4/a1/a2/a3/a4/a5/a6/a7","get_7:1:2:3:4:5:6:7");

		TESTM("GET","/res_1/a1/a2/a3/a4/a5/a6/a7/a8","get_8:1:2:3:4:5:6:7:8");
		TESTM("GET","/res_2/a1/a2/a3/a4/a5/a6/a7/a8","get_8:1:2:3:4:5:6:7:8");
		TESTM("GET","/res_3/a1/a2/a3/a4/a5/a6/a7/a8","get_8:1:2:3:4:5:6:7:8");
		TESTM("GET","/res_4/a1/a2/a3/a4/a5/a6/a7/a8","get_8:1:2:3:4:5:6:7:8");
	}